

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O1

string * __thiscall
deqp::egl::(anonymous_namespace)::configListToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Library *egl,
          EGLDisplay *display,vector<void_*,_std::allocator<void_*>_> *configs)

{
  EGLint EVar1;
  undefined8 *puVar2;
  long *local_1d8;
  long local_1c8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  Library *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1b8;
  local_1b0 = egl;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x1b32ab9);
  puVar2 = (undefined8 *)*display;
  if (puVar2 != (undefined8 *)display[1]) {
    do {
      EVar1 = eglu::getConfigID((Library *)this,local_1b0->_vptr_Library,(EGLConfig)*puVar2);
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,EVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1d8);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != (undefined8 *)display[1]);
  }
  return __return_storage_ptr__;
}

Assistant:

string configListToString (const Library& egl, const EGLDisplay& display, const vector<EGLConfig>& configs)
{
	string str = "";
	for (vector<EGLConfig>::const_iterator cfgIter = configs.begin(); cfgIter != configs.end(); cfgIter++)
	{
		EGLConfig	config		= *cfgIter;
		EGLint		configId	= eglu::getConfigID(egl, display, config);

		if (str.length() != 0)
			str += " ";

		str += de::toString(configId);
	}
	return str;
}